

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::Export_MetadataInteger
          (X3DExporter *this,aiString *pKey,int32_t pValue,size_t pTabLevel)

{
  pointer pcVar1;
  uint uVar2;
  _Node *p_Var3;
  uint uVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  allocator local_89;
  undefined1 local_88 [32];
  _Alloc_hider local_68 [2];
  char local_58 [16];
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_48;
  
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  local_88._0_8_ = local_88 + 0x10;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"name","");
  std::__cxx11::string::string((string *)local_68,pKey->data,&local_89);
  p_Var3 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48,(SAttribute *)local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
  if (local_68[0]._M_p != local_58) {
    operator_delete(local_68[0]._M_p);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_);
  }
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"value","");
  __val = -pValue;
  if (0 < pValue) {
    __val = pValue;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_006d42c4;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_006d42c4;
      }
      if (uVar4 < 10000) goto LAB_006d42c4;
      uVar5 = uVar5 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_006d42c4:
  local_68[0]._M_p = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,(char)__len - (char)(pValue >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_68[0]._M_p + ((uint)pValue >> 0x1f),__len,__val);
  p_Var3 = std::__cxx11::
           list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
           _M_create_node<Assimp::X3DExporter::SAttribute>
                     ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48,(SAttribute *)local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
  pcVar1 = local_88 + 0x10;
  if (local_68[0]._M_p != local_58) {
    operator_delete(local_68[0]._M_p);
  }
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"MetadataInteger","");
  NodeHelper_OpenNode(this,(string *)local_88,pTabLevel,true,
                      (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&local_48);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_48);
  return;
}

Assistant:

void X3DExporter::Export_MetadataInteger(const aiString& pKey, const int32_t pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", to_string(pValue)});
	NodeHelper_OpenNode("MetadataInteger", pTabLevel, true, attr_list);
}